

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::FboTestCase::checkFormatSupport(FboTestCase *this,deUint32 sizedFormat)

{
  uint uVar1;
  bool bVar2;
  RenderContext *pRVar3;
  NotSupportedError *this_00;
  RenderContext *renderContext;
  allocator<char> local_61;
  string local_60;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  requiredExts;
  bool isCoreFormat;
  deUint32 sizedFormat_local;
  FboTestCase *this_local;
  
  requiredExts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = sizedFormat;
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  requiredExts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = isRequiredFormat(sizedFormat,pRVar3);
  uVar1 = requiredExts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  if ((bool)requiredExts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_) {
    memset(local_30,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30);
  }
  else {
    renderContext =
         (RenderContext *)
         (ulong)requiredExts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    getEnablingExtensions_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_30,(Functional *)(ulong)uVar1,(deUint32)pRVar3,renderContext);
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_30);
  if (!bVar2) {
    bVar2 = isAnyExtensionSupported
                      ((this->super_TestCase).m_context,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_30);
    if (!bVar2) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"Format not supported",&local_61);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_60);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return;
}

Assistant:

void FboTestCase::checkFormatSupport (deUint32 sizedFormat)
{
	const bool						isCoreFormat	= isRequiredFormat(sizedFormat, m_context.getRenderContext());
	const std::vector<std::string>	requiredExts	= (!isCoreFormat) ? getEnablingExtensions(sizedFormat, m_context.getRenderContext()) : std::vector<std::string>();

	// Check that we don't try to use invalid formats.
	DE_ASSERT(isCoreFormat || !requiredExts.empty());

	if (!requiredExts.empty() && !isAnyExtensionSupported(m_context, requiredExts))
		throw tcu::NotSupportedError("Format not supported");
}